

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O1

int64_t __thiscall avro::BinaryDecoder::doDecodeLong(BinaryDecoder *this)

{
  byte bVar1;
  byte *pbVar2;
  int64_t iVar3;
  undefined8 *puVar4;
  ulong input;
  ulong uVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar5 = 0;
  input = 0;
  do {
    if (0x3f < uVar5) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Invalid Avro varint","");
      std::runtime_error::runtime_error((runtime_error *)(puVar4 + 1),(string *)local_48);
      *puVar4 = 0x1cd6f0;
      puVar4[1] = 0x1cd720;
      __cxa_throw(puVar4,&Exception::typeinfo,Exception::~Exception);
    }
    if ((this->in_).next_ == (this->in_).end_) {
      StreamReader::more(&this->in_);
    }
    pbVar2 = (this->in_).next_;
    (this->in_).next_ = pbVar2 + 1;
    bVar1 = *pbVar2;
    input = input | (ulong)(bVar1 & 0x7f) << ((byte)uVar5 & 0x3f);
    uVar5 = uVar5 + 7;
  } while ((char)bVar1 < '\0');
  iVar3 = decodeZigzag64(input);
  return iVar3;
}

Assistant:

int64_t BinaryDecoder::doDecodeLong() {
    uint64_t encoded = 0;
    int shift = 0;
    uint8_t u;
    do {
        if (shift >= 64) {
            throw Exception("Invalid Avro varint");
        }
        u = in_.read();
        encoded |= static_cast<uint64_t>(u & 0x7f) << shift;
        shift += 7;
    } while (u & 0x80);

    return decodeZigzag64(encoded);
}